

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall Lodtalk::MethodCompiler::visitSequenceNode(MethodCompiler *this,SequenceNode *node)

{
  bool bVar1;
  bool bVar2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *this_00;
  reference ppNVar3;
  Node **child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range1;
  bool first;
  SequenceNode *node_local;
  MethodCompiler *this_local;
  
  bVar1 = true;
  this_00 = AST::SequenceNode::getChildren(node);
  __end1 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::begin(this_00);
  child = (Node **)std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::end
                             (this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                                *)&child);
    if (!bVar2) break;
    ppNVar3 = __gnu_cxx::
              __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
              ::operator*(&__end1);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      MethodAssembler::Assembler::popStackTop(&this->gen);
    }
    (*(*ppNVar3)->_vptr_Node[2])(*ppNVar3,this);
    __gnu_cxx::
    __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
    ::operator++(&__end1);
  }
  Oop::Oop((Oop *)&this_local);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodCompiler::visitSequenceNode(SequenceNode *node)
{
	bool first = true;
	for(auto &child : node->getChildren())
	{
		if(first)
			first = false;
		else
			gen.popStackTop();

		child->acceptVisitor(this);
	}

	return Oop();
}